

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::flash_read_id(Spi *this)

{
  int i;
  long lVar1;
  long lVar2;
  uint8_t data [260];
  byte local_128 [5];
  uint8_t local_123 [259];
  
  memset(local_128,0,0x104);
  local_128[0] = 0x9f;
  if (this->verbose == true) {
    fwrite("read flash ID..\n",0x10,1,_stdout);
  }
  set_gpio(this,0,0);
  xfer_spi(this,local_128,5);
  lVar2 = 5;
  if (local_128[4] != 0) {
    if (local_128[4] == 0xff) {
      flash_read_id();
    }
    else {
      lVar2 = (ulong)local_128[4] + 5;
      xfer_spi(this,local_123,(uint)local_128[4]);
    }
  }
  set_gpio(this,1,0);
  lVar1 = 1;
  fwrite("flash ID:",9,1,_stdout);
  do {
    fprintf(_stdout," 0x%02X",(ulong)local_128[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar2 != lVar1);
  fputc(10,_stdout);
  return;
}

Assistant:

void Spi::flash_read_id() {
	/* JEDEC ID structure:
	 * Byte No. | Data Type
	 * ---------+----------
	 *        0 | FC_JEDECID Request Command
	 *        1 | MFG ID
	 *        2 | Dev ID 1
	 *        3 | Dev ID 2
	 *        4 | Ext Dev Str Len
	 */

	uint8_t data[260] = { FC_JEDECID };
	int len = 5; // command + 4 response bytes

	if (verbose)
		fprintf(stdout, "read flash ID..\n");

	flash_chip_select();

	// Write command and read first 4 bytes
	xfer_spi(data, len);

	if (data[4] == 0xFF)
		fprintf(stderr, "Extended Device String Length is 0xFF, "
				"this is likely a read error. Ignorig...\n");
	else {
		// Read extended JEDEC ID bytes
		if (data[4] != 0) {
			len += data[4];
			xfer_spi(data + 5, len - 5);
		}
	}

	flash_chip_deselect();

	fprintf(stdout, "flash ID:");
	for (int i = 1; i < len; i++)
		fprintf(stdout, " 0x%02X", data[i]);
	fprintf(stdout, "\n");
}